

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.hpp
# Opt level: O2

vector<record,_std::allocator<record>_> * __thiscall
Tree::search(vector<record,_std::allocator<record>_> *__return_storage_ptr__,Tree *this,int key,
            Vertex *root)

{
  int iVar1;
  long lStack_30;
  vector<record,_std::allocator<record>_> tempVector;
  
  tempVector.super__Vector_base<record,_std::allocator<record>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  tempVector.super__Vector_base<record,_std::allocator<record>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  tempVector.super__Vector_base<record,_std::allocator<record>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if (root == (Vertex *)0x0) {
    (__return_storage_ptr__->super__Vector_base<record,_std::allocator<record>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<record,_std::allocator<record>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<record,_std::allocator<record>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    tempVector.super__Vector_base<record,_std::allocator<record>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    tempVector.super__Vector_base<record,_std::allocator<record>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    tempVector.super__Vector_base<record,_std::allocator<record>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
  }
  else {
    iVar1 = (int)((root->data).super__Vector_base<record,_std::allocator<record>_>._M_impl.
                  super__Vector_impl_data._M_start)->year;
    if (key < iVar1) {
      lStack_30 = 0x20;
    }
    else {
      if (key <= iVar1) {
        std::vector<record,_std::allocator<record>_>::vector(__return_storage_ptr__,&root->data);
        goto LAB_0010325f;
      }
      lStack_30 = 0x18;
    }
    search(__return_storage_ptr__,this,key,
           *(Vertex **)
            ((long)&(root->data).super__Vector_base<record,_std::allocator<record>_>._M_impl.
                    super__Vector_impl_data._M_start + lStack_30));
  }
LAB_0010325f:
  std::_Vector_base<record,_std::allocator<record>_>::~_Vector_base
            (&tempVector.super__Vector_base<record,_std::allocator<record>_>);
  return __return_storage_ptr__;
}

Assistant:

vector<record> search(int key, Vertex *root) {
        vector<record> tempVector;
        if (!root) return tempVector;
        if (key < root->data[0].year)
            return search(key, root->ptrLeft);
        else if (key > root->data[0].year)
            return search(key, root->ptrRight);
        return root->data;
    }